

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

bool iutest::internal::iuOperatorEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
               (char (*v1) [4],basic_string_view<char,_std::char_traits<char>_> *v2)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> *v2_local;
  char (*v1_local) [4];
  
  local_18 = v2;
  v2_local = (basic_string_view<char,_std::char_traits<char>_> *)v1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,*v1);
  bVar1 = std::operator==(local_28,*local_18);
  return bVar1;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}